

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b_rle.h
# Opt level: O3

int32_t FastPForLib::Simple8b_Codec::Compress
                  (uint32_t *input,int32_t inOffset,uint32_t inCount,uint64_t *output,
                  int32_t outOffset)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  long lVar5;
  uint64_t uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  
  uVar7 = inCount + inOffset;
  uVar8 = outOffset;
  uVar11 = outOffset;
  if ((uint)inOffset < uVar7) {
    do {
      uVar8 = uVar7 - inOffset;
      uVar4 = tryRunLength(input,inOffset,uVar8);
      uVar9 = (ulong)(uint)inOffset;
      if (uVar4 == 0) {
        lVar5 = 1;
        do {
          uVar2 = *(uint *)(Simple8b_Codec_bitLength + (uint)((0xf - (int)lVar5) * 4));
          if (uVar8 <= *(uint *)(Simple8b_Codec_bitLength + (uint)((0xf - (int)lVar5) * 4))) {
            uVar2 = uVar8;
          }
          uVar6 = lVar5 << 0x3c;
          if (uVar2 == 0) {
            uVar9 = 0;
          }
          else {
            uVar10 = 0;
            uVar9 = 0;
            while (iVar3 = (int)uVar9,
                  input[(uint)(inOffset + iVar3)] >>
                  ((ulong)*(uint *)(Simple8b_Codec_bitLength + lVar5 * 4) & 0x3f) == 0) {
              uVar1 = uVar10 & 0x3f;
              uVar9 = uVar9 + 1;
              uVar10 = (ulong)((int)uVar10 + *(uint *)(Simple8b_Codec_bitLength + lVar5 * 4));
              uVar6 = uVar6 | (ulong)input[(uint)(inOffset + iVar3)] << uVar1;
              if (uVar2 == uVar9) goto LAB_00128ebe;
            }
          }
          if ((uint)uVar9 == uVar2) {
LAB_00128ebe:
            inOffset = inOffset + uVar2;
            if (lVar5 != 0xf) goto LAB_00128ee3;
            break;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0xf);
        uVar9 = (ulong)(uint)inOffset;
        inOffset = inOffset + 1;
        uVar6 = (ulong)input[uVar9] | 0xf000000000000000;
      }
      else {
        if (0xffffffe < uVar4) {
          uVar4 = 0xfffffff;
        }
        inOffset = uVar4 + inOffset;
        uVar6 = CONCAT44(uVar4,input[uVar9]) | 0xf000000000000000;
      }
LAB_00128ee3:
      uVar8 = uVar11 + 1;
      output[uVar11] = uVar6;
      uVar11 = uVar8;
    } while ((uint)inOffset < uVar7);
  }
  return uVar8 - outOffset;
}

Assistant:

static int32_t Compress(const uint32_t *input, int32_t inOffset,
                          uint32_t inCount, uint64_t *output,
                          int32_t outOffset) {
    uint32_t inPos = inOffset;
    uint32_t inEnd = inOffset + inCount;
    uint32_t outPos = outOffset;

    while (inPos < inEnd) {
      uint32_t remainingCount = inEnd - inPos;
      uint64_t outVal = 0;

#if defined(_SIMPLE8B_USE_RLE)
      // try if run-length encoding packs better than bit packing
      uint64_t repeatCount = tryRunLength(input, inPos, remainingCount);
      if (repeatCount > 0) {
        repeatCount = (repeatCount < RLE_MAX_COUNT_MASK) ? repeatCount
                                                         : RLE_MAX_COUNT_MASK;
        outVal = (static_cast<uint64_t>(SIMPLE8B_MAXCODE) << SIMPLE8B_BITSIZE) |
                 (repeatCount << RLE_MAX_VALUE_BITS) | input[inPos];
        inPos += static_cast<uint32_t>(repeatCount);
      } else
#endif
      {
        // otherwise try all the bit packing possibilities
        uint32_t code = SIMPLE8B_MINCODE;
        for (; code < SIMPLE8B_MAXCODE; code++) {
          uint32_t intNum = Simple8b_Codec_bitLength[SIMPLE8B_MAXCODE - code];
          uint32_t bitLen = Simple8b_Codec_bitLength[code];
          intNum = (intNum < remainingCount) ? intNum : remainingCount;

          uint64_t maxVal = (1ULL << bitLen) - 1;
          uint64_t val = static_cast<uint64_t>(code) << SIMPLE8B_BITSIZE;
          uint32_t j = 0;
          for (; j < intNum; j++) {
            uint64_t inputVal = static_cast<uint64_t>(input[inPos + j]);
            if (inputVal > maxVal) {
              break;
            }
            val |= inputVal << (j * bitLen);
          }
          if (j == intNum) {
            outVal = val;
            inPos += intNum;
            break;
          }
        }
        // if no bit packing possible, encode just one value
        if (code == SIMPLE8B_MAXCODE) {
          outVal = (static_cast<uint64_t>(code) << SIMPLE8B_BITSIZE) |
                   input[inPos++];
        }
      }
      output[outPos++] = outVal;
    }
    return outPos - outOffset;
  }